

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimizer_engine.cpp
# Opt level: O0

void __thiscall ram::MinimizerEngine::Filter(MinimizerEngine *this,double frequency)

{
  bool bVar1;
  invalid_argument *this_00;
  reference pIVar2;
  size_type sVar3;
  iterator __last;
  reference pvVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_a8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_a0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_98;
  uint local_8c;
  uint local_88 [2];
  reference local_80;
  value_type *jt;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<unsigned_long,_unsigned_long,_ram::MinimizerEngine::Index::Hash,_ram::MinimizerEngine::Index::KeyEqual,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *__range2;
  Index *it;
  iterator __end1;
  iterator __begin1;
  vector<ram::MinimizerEngine::Index,_std::allocator<ram::MinimizerEngine::Index>_> *__range1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> occurrences;
  double frequency_local;
  MinimizerEngine *this_local;
  
  if ((0.0 <= frequency) && (frequency <= 1.0)) {
    if ((frequency != 0.0) || (NAN(frequency))) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
      __end1 = std::
               vector<ram::MinimizerEngine::Index,_std::allocator<ram::MinimizerEngine::Index>_>::
               begin(&this->index_);
      it = (Index *)std::
                    vector<ram::MinimizerEngine::Index,_std::allocator<ram::MinimizerEngine::Index>_>
                    ::end(&this->index_);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<ram::MinimizerEngine::Index_*,_std::vector<ram::MinimizerEngine::Index,_std::allocator<ram::MinimizerEngine::Index>_>_>
                                    *)&it);
        if (!bVar1) break;
        pIVar2 = __gnu_cxx::
                 __normal_iterator<ram::MinimizerEngine::Index_*,_std::vector<ram::MinimizerEngine::Index,_std::allocator<ram::MinimizerEngine::Index>_>_>
                 ::operator*(&__end1);
        __end2 = std::
                 unordered_map<unsigned_long,_unsigned_long,_ram::MinimizerEngine::Index::Hash,_ram::MinimizerEngine::Index::KeyEqual,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::begin(&pIVar2->locator);
        jt = (value_type *)
             std::
             unordered_map<unsigned_long,_unsigned_long,_ram::MinimizerEngine::Index::Hash,_ram::MinimizerEngine::Index::KeyEqual,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::end(&pIVar2->locator);
        while( true ) {
          bVar1 = std::__detail::operator!=
                            (&__end2.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_true>
                             ,(_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_true>
                               *)&jt);
          if (!bVar1) break;
          local_80 = std::__detail::
                     _Node_const_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_true>
                     ::operator*(&__end2);
          if ((local_80->first & 1) == 0) {
            local_88[0] = (uint)local_80->second;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1,local_88);
          }
          else {
            local_88[1] = 1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1,
                       (int *)(local_88 + 1));
          }
          std::__detail::
          _Node_const_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_true>::
          operator++(&__end2);
        }
        __gnu_cxx::
        __normal_iterator<ram::MinimizerEngine::Index_*,_std::vector<ram::MinimizerEngine::Index,_std::allocator<ram::MinimizerEngine::Index>_>_>
        ::operator++(&__end1);
      }
      bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
      if (bVar1) {
        this->occurrence_ = 0xffffffff;
      }
      else {
        local_98._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
        local_a8._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
        sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
        auVar7._8_4_ = (int)(sVar3 >> 0x20);
        auVar7._0_8_ = sVar3;
        auVar7._12_4_ = 0x45300000;
        local_a0 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator+(&local_a8,
                               (long)((1.0 - frequency) *
                                     ((auVar7._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0))
                                     ));
        __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
        std::
        nth_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  (local_98,local_a0,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )__last._M_current);
        sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
        auVar8._8_4_ = (int)(sVar3 >> 0x20);
        auVar8._0_8_ = sVar3;
        auVar8._12_4_ = 0x45300000;
        dVar6 = (1.0 - frequency) *
                ((auVar8._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0));
        uVar5 = (ulong)dVar6;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1,
                            uVar5 | (long)(dVar6 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f);
        this->occurrence_ = *pvVar4 + 1;
      }
      local_8c = (uint)bVar1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
    }
    else {
      this->occurrence_ = 0xffffffff;
    }
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,"[ram::MinimizerEngine::Filter] error: invalid frequency");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void MinimizerEngine::Filter(double frequency) {
  if (!(0 <= frequency && frequency <= 1)) {
    throw std::invalid_argument(
        "[ram::MinimizerEngine::Filter] error: invalid frequency");
  }

  if (frequency == 0) {
    occurrence_ = -1;
    return;
  }

  std::vector<std::uint32_t> occurrences;
  for (const auto& it : index_) {
    for (const auto& jt : it.locator) {
      if (jt.first & 1) {
        occurrences.emplace_back(1);
      } else {
        occurrences.emplace_back(static_cast<std::uint32_t>(jt.second));
      }
    }
  }

  if (occurrences.empty()) {
    occurrence_ = -1;
    return;
  }

  std::nth_element(
      occurrences.begin(),
      occurrences.begin() + (1 - frequency) * occurrences.size(),
      occurrences.end());
  occurrence_ = occurrences[(1 - frequency) * occurrences.size()] + 1;
}